

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvTools.cpp
# Opt level: O3

void glslang::SpirvToolsStripDebugInfo
               (TIntermediate *intermediate,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv,SpvBuildLogger *logger)

{
  uint32_t *original_binary;
  spv_target_env sVar1;
  spv_optimizer_options options;
  Optimizer optimizer;
  Optimizer OStack_58;
  PassToken local_50;
  MessageConsumer local_48;
  
  sVar1 = MapToSpirvToolsEnv(&intermediate->spvVersion,logger);
  spvtools::Optimizer::Optimizer(&OStack_58,sVar1);
  local_48.super__Function_base._M_functor._8_8_ = 0;
  local_48.super__Function_base._M_functor._M_unused._M_object = OptimizerMesssageConsumer;
  local_48._M_invoker =
       std::
       _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_void_(*)(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
       ::_M_invoke;
  local_48.super__Function_base._M_manager =
       std::
       _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_void_(*)(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
       ::_M_manager;
  spvtools::Optimizer::SetMessageConsumer(&OStack_58,&local_48);
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)
              ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  spvtools::CreateStripDebugInfoPass();
  spvtools::Optimizer::RegisterPass(&OStack_58,&local_50);
  spvtools::Optimizer::PassToken::~PassToken(&local_50);
  options = spvOptimizerOptionsCreate();
  sVar1 = MapToSpirvToolsEnv(&intermediate->spvVersion,logger);
  spvtools::Optimizer::SetTargetEnv(&OStack_58,sVar1);
  spvOptimizerOptionsSetRunValidator(options,false);
  original_binary =
       (spirv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  spvtools::Optimizer::Run
            (&OStack_58,original_binary,
             (long)(spirv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)original_binary >> 2,spirv,options);
  spvOptimizerOptionsDestroy(options);
  spvtools::Optimizer::~Optimizer(&OStack_58);
  return;
}

Assistant:

void SpirvToolsStripDebugInfo(const glslang::TIntermediate& intermediate,
        std::vector<unsigned int>& spirv, spv::SpvBuildLogger* logger)
{
    spv_target_env target_env = MapToSpirvToolsEnv(intermediate.getSpv(), logger);

    spvtools::Optimizer optimizer(target_env);
    optimizer.SetMessageConsumer(OptimizerMesssageConsumer);

    optimizer.RegisterPass(spvtools::CreateStripDebugInfoPass());

    spvtools::OptimizerOptions spvOptOptions;
    optimizer.SetTargetEnv(MapToSpirvToolsEnv(intermediate.getSpv(), logger));
    spvOptOptions.set_run_validator(false); // The validator may run as a separate step later on
    optimizer.Run(spirv.data(), spirv.size(), &spirv, spvOptOptions);
}